

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primrefgen_presplit.h
# Opt level: O2

PrimInfo * __thiscall
embree::sse2::
createPrimRefArray_presplit<embree::TriangleMesh,embree::sse2::TriangleSplitterFactory>
          (PrimInfo *__return_storage_ptr__,sse2 *this,Scene *scene,GTypeMask types,bool mblur,
          size_t numPrimRefs,mvector<PrimRef> *prims,BuildProgressMonitor *progressMonitor)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  char cVar6;
  int iVar7;
  size_t sVar8;
  ulong uVar9;
  runtime_error *prVar10;
  ulong uVar11;
  ulong uVar12;
  size_t i;
  size_t sVar13;
  size_t sVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  undefined7 in_register_00000081;
  size_t N;
  ulong uVar18;
  size_t *psVar19;
  ulong uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  anon_class_8_1_a89d07ac *in_stack_ffffffffffffd178;
  size_t taskCount_1;
  sse2 *local_2e70;
  size_t local_2e68;
  Scene *local_2e60;
  size_t taskCount;
  Scene *local_2e50;
  anon_class_8_1_78f12065 split_primitive;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_2e18;
  undefined4 local_2e08;
  undefined4 uStack_2e04;
  undefined4 uStack_2e00;
  undefined4 uStack_2dfc;
  Scene *scene_local;
  PrimInfo pinfo;
  TriangleSplitterFactory Splitter;
  anon_class_8_1_a89d07ac primitiveArea;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_2cd8;
  size_t local_2cc8;
  size_t sStack_2cc0;
  Iterator2 iter;
  anon_class_8_1_a89d07ac local_2c98;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_2c90;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_2c80;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_2c70;
  undefined8 uStack_2c60;
  size_t local_2c58;
  size_t sStack_2c50;
  TriangleSplitterFactory local_2c48;
  size_t local_2c40 [63];
  Scene *local_2a48;
  ulong local_2a40 [63];
  ulong local_2848;
  ulong local_2840;
  size_t local_13f8 [633];
  
  local_2e70 = (sse2 *)CONCAT71(in_register_00000081,mblur);
  iter.mblur = SUB81(types,0);
  scene_local = (Scene *)this;
  iter.scene = (Scene *)this;
  iter.typemask = (GTypeMask)scene;
  (*(code *)((prims->alloc).device)->_vptr_MemoryMonitorInterface)(prims,0);
  sVar14 = *(size_t *)(this + 0x1d8);
  uVar18 = 0;
  Splitter.scene = (Scene *)&iter;
  for (sVar13 = 0; sVar14 != sVar13; sVar13 = sVar13 + 1) {
    sVar8 = ParallelForForState::init<embree::Scene::Iterator2>::anon_class_8_1_4d25ca37::operator()
                      ((anon_class_8_1_4d25ca37 *)&Splitter,sVar13);
    uVar18 = uVar18 + sVar8;
  }
  local_2840 = uVar18;
  iVar7 = tbb::detail::d1::max_concurrency();
  uVar11 = uVar18 + 0x3ff >> 10;
  if ((ulong)(long)iVar7 < uVar11) {
    uVar11 = (long)iVar7;
  }
  uVar15 = 0x40;
  if (uVar11 < 0x40) {
    uVar15 = uVar11;
  }
  sVar14 = 0;
  uVar15 = uVar15 + (uVar15 == 0);
  local_2c48.scene = (Scene *)0x0;
  local_2a48 = (Scene *)0x0;
  uVar9 = uVar18 / uVar15;
  uVar11 = 1;
  uVar20 = 0;
  local_2848 = uVar15;
  while (uVar11 < uVar15) {
    sVar13 = ParallelForForState::init<embree::Scene::Iterator2>::anon_class_8_1_4d25ca37::
             operator()((anon_class_8_1_4d25ca37 *)&Splitter,sVar14);
    uVar16 = (uVar11 + 1) * uVar18;
    uVar17 = 0;
    uVar12 = uVar20;
    for (; ((uVar20 = (uVar12 + sVar13) - uVar17, uVar17 < sVar13 && (uVar9 <= uVar20)) &&
           (uVar11 < uVar15)); uVar11 = uVar11 + 1) {
      local_2c40[uVar11 - 1] = sVar14;
      uVar17 = uVar17 + (uVar9 - uVar12);
      local_2a40[uVar11 - 1] = uVar17;
      uVar20 = uVar16 / local_2848;
      uVar16 = uVar16 + uVar18;
      uVar12 = uVar9;
      uVar15 = local_2848;
      uVar9 = uVar20;
    }
    sVar14 = sVar14 + 1;
  }
  primitiveArea.scene = (Scene **)0x7f8000007f800000;
  local_2c98.scene = &local_2e60;
  taskCount_1 = (size_t)&iter;
  split_primitive.Splitter = &local_2c48;
  local_2e60 = (Scene *)numPrimRefs;
  taskCount = uVar15;
  aStack_2c90._0_8_ = taskCount_1;
  tbb::detail::d1::task_group_context::task_group_context
            ((task_group_context *)&Splitter,(context_traits)0x4,CUSTOM_CTX);
  pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._0_8_ =
       &split_primitive;
  tbb::detail::d1::
  parallel_for<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_for_h:32:43)>
            (0,uVar15,1,(anon_class_8_1_898bcfc2_conflict5 *)&pinfo,(task_group_context *)&Splitter)
  ;
  cVar6 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&Splitter);
  if (cVar6 == '\0') {
    tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)&Splitter);
    local_2cd8.m128[0] = -INFINITY;
    local_2cd8.m128[1] = -INFINITY;
    local_2cd8.m128[2] = -INFINITY;
    local_2cd8.m128[3] = -INFINITY;
    pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._0_8_ =
         primitiveArea.scene;
    pinfo.begin = 0;
    pinfo.end = 0;
    psVar19 = local_13f8;
    uVar21 = primitiveArea.scene._0_4_;
    uVar22 = primitiveArea.scene._4_4_;
    uVar1 = (Iterator2 *)0x7f8000007f800000;
    uVar2 = (anon_class_8_1_a89d07ac *)0xff800000ff800000;
    uVar3 = (Scene **)0xff800000ff800000;
    uVar4 = (size_t *)0x7f8000007f800000;
    uVar5 = (anon_class_8_1_a89d07ac *)0x7f8000007f800000;
    for (uVar18 = 0;
        pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[0] =
             local_2cd8.m128[0],
        pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[1] =
             local_2cd8.m128[1],
        pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[2] =
             local_2cd8.m128[2],
        pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[3] =
             local_2cd8.m128[3],
        pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._8_8_ = uVar1,
        pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._0_8_ = uVar2,
        pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._8_8_ = uVar3,
        pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_8_ = uVar4,
        pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_8_ = uVar5,
        uVar18 < taskCount; uVar18 = uVar18 + 1) {
      Splitter.scene = (Scene *)psVar19[-0x288];
      *(undefined4 *)(psVar19 + -8) = uVar21;
      *(undefined4 *)((long)psVar19 + -0x3c) = uVar22;
      psVar19[-7] = uVar1;
      psVar19[-6] = uVar2;
      psVar19[-5] = uVar3;
      psVar19[-4] = uVar4;
      psVar19[-3] = uVar5;
      *(undefined4 *)(psVar19 + -2) = local_2cd8.m128[0];
      *(undefined4 *)((long)psVar19 + -0xc) = local_2cd8.m128[1];
      *(undefined4 *)(psVar19 + -1) = local_2cd8.m128[2];
      *(undefined4 *)((long)psVar19 + -4) = local_2cd8.m128[3];
      *psVar19 = pinfo.begin;
      psVar19[1] = pinfo.end;
      createPrimRefArray_presplit<embree::TriangleMesh,_embree::sse2::TriangleSplitterFactory>::
      anon_class_1_0_00000001::operator()
                ((PrimInfo *)&split_primitive,(anon_class_1_0_00000001 *)&local_2e68,&pinfo,
                 (PrimInfo *)&Splitter);
      pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._0_8_ =
           split_primitive.Splitter;
      pinfo.begin = CONCAT44(uStack_2e04,local_2e08);
      pinfo.end = CONCAT44(uStack_2dfc,uStack_2e00);
      psVar19 = psVar19 + 10;
      uVar21 = split_primitive.Splitter._0_4_;
      uVar22 = split_primitive.Splitter._4_4_;
      local_2cd8._0_4_ = local_2e18.m128[0];
      local_2cd8._4_4_ = local_2e18.m128[1];
      local_2cd8._8_4_ = local_2e18.m128[2];
      local_2cd8._12_4_ = local_2e18.m128[3];
      uVar1 = (Iterator2 *)&taskCount;
      uVar2 = &primitiveArea;
      uVar3 = &taskCount_1;
      uVar4 = &local_2e68;
      uVar5 = &local_2c98;
    }
    if ((sse2 *)(pinfo.end - pinfo.begin) != local_2e70) {
      (*(code *)((prims->alloc).device)->_vptr_MemoryMonitorInterface)(prims,0);
      uVar18 = local_2848;
      local_2c98.scene = (Scene **)0x7f8000007f800000;
      aStack_2c90._0_8_ = (Iterator2 *)0x7f8000007f800000;
      aStack_2c90._8_8_ = (anon_class_8_1_a89d07ac *)0xff800000ff800000;
      aStack_2c80._0_8_ = (Scene **)0xff800000ff800000;
      aStack_2c80._8_8_ = (size_t *)0x7f8000007f800000;
      aStack_2c70._0_8_ = (anon_class_8_1_a89d07ac *)0x7f8000007f800000;
      aStack_2c70._8_8_ = 0xff800000ff800000;
      uStack_2c60._0_4_ = -INFINITY;
      uStack_2c60._4_4_ = -INFINITY;
      local_2c58 = 0;
      sStack_2c50 = 0;
      local_2e60 = (Scene *)&iter;
      taskCount_1 = local_2848;
      split_primitive.Splitter = &local_2c48;
      local_2e68 = numPrimRefs;
      taskCount = (size_t)&local_2e68;
      local_2e50 = local_2e60;
      tbb::detail::d1::task_group_context::task_group_context
                ((task_group_context *)&Splitter,(context_traits)0x4,CUSTOM_CTX);
      primitiveArea.scene = (Scene **)&split_primitive;
      tbb::detail::d1::
      parallel_for<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_for_h:32:43)>
                (0,uVar18,1,(anon_class_8_1_898bcfc2_conflict5 *)&primitiveArea,
                 (task_group_context *)&Splitter);
      cVar6 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&Splitter);
      if (cVar6 != '\0') {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar10,"task cancelled");
        __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)&Splitter);
      primitiveArea.scene = local_2c98.scene;
      local_2cc8 = local_2c58;
      sStack_2cc0 = sStack_2c50;
      psVar19 = local_13f8;
      uVar21 = aStack_2c70.m128[2];
      uVar22 = aStack_2c70.m128[3];
      uVar23 = (float)uStack_2c60;
      uVar24 = uStack_2c60._4_4_;
      uVar25 = local_2c98.scene._0_4_;
      uVar26 = local_2c98.scene._4_4_;
      uVar1 = aStack_2c90._0_8_;
      uVar2 = aStack_2c90._8_8_;
      uVar3 = aStack_2c80._0_8_;
      uVar4 = aStack_2c80._8_8_;
      uVar5 = aStack_2c70._0_8_;
      for (uVar18 = 0; uVar18 < taskCount_1; uVar18 = uVar18 + 1) {
        Splitter.scene = (Scene *)psVar19[-0x288];
        *(undefined4 *)(psVar19 + -8) = uVar25;
        *(undefined4 *)((long)psVar19 + -0x3c) = uVar26;
        psVar19[-7] = uVar1;
        psVar19[-6] = uVar2;
        psVar19[-5] = uVar3;
        psVar19[-4] = uVar4;
        psVar19[-3] = uVar5;
        *(undefined4 *)(psVar19 + -2) = uVar21;
        *(undefined4 *)((long)psVar19 + -0xc) = uVar22;
        *(undefined4 *)(psVar19 + -1) = uVar23;
        *(undefined4 *)((long)psVar19 + -4) = uVar24;
        *psVar19 = local_2cc8;
        psVar19[1] = sStack_2cc0;
        createPrimRefArray_presplit<embree::TriangleMesh,_embree::sse2::TriangleSplitterFactory>::
        anon_class_1_0_00000001::operator()
                  ((PrimInfo *)&split_primitive,(anon_class_1_0_00000001 *)&stack0xffffffffffffd17f,
                   (PrimInfo *)&primitiveArea,(PrimInfo *)&Splitter);
        primitiveArea.scene = &(split_primitive.Splitter)->scene;
        local_2cc8 = CONCAT44(uStack_2e04,local_2e08);
        sStack_2cc0 = CONCAT44(uStack_2dfc,uStack_2e00);
        psVar19 = psVar19 + 10;
        uVar21 = local_2e18.m128[0];
        uVar22 = local_2e18.m128[1];
        uVar23 = local_2e18.m128[2];
        uVar24 = local_2e18.m128[3];
        uVar25 = split_primitive.Splitter._0_4_;
        uVar26 = split_primitive.Splitter._4_4_;
        uVar1 = (Iterator2 *)&taskCount_1;
        uVar2 = &local_2c98;
        uVar3 = &local_2e60;
        uVar4 = &stack0xffffffffffffd17f;
        uVar5 = (anon_class_8_1_a89d07ac *)&taskCount;
      }
      pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0.m128[1] =
           (float)uVar26;
      pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0.m128[0] =
           (float)uVar25;
      pinfo.begin = local_2cc8;
      pinfo.end = sStack_2cc0;
      pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[0] =
           (float)uVar21;
      pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[1] =
           (float)uVar22;
      pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[2] =
           (float)uVar23;
      pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[3] =
           (float)uVar24;
    }
    primitiveArea.scene = &scene_local;
    split_primitive.Splitter = &Splitter;
    Splitter.scene = (Scene *)this;
    pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._8_8_ = uVar1;
    pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._0_8_ = uVar2;
    pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._8_8_ = uVar3;
    pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_8_ = uVar4;
    pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_8_ = uVar5;
    createPrimRefArray_presplit<embree::sse2::createPrimRefArray_presplit<embree::TriangleMesh,embree::sse2::TriangleSplitterFactory>(embree::Scene*,embree::Geometry::GTypeMask,bool,unsigned_long,embree::vector_t<embree::PrimRef,embree::aligned_monitored_allocator<embree::PrimRef,32ul>>&,embree::BuildProgressMonitor&)::_lambda(embree::PrimRef_const&,unsigned_int,embree::sse2::SplittingGrid_const&,embree::PrimRef*,unsigned_int&)_1_,embree::sse2::createPrimRefArray_presplit<embree::TriangleMesh,embree::sse2::TriangleSplitterFactory>(embree::Scene*,embree::Geometry::GTypeMask,bool,unsigned_long,embree::vector_t<embree::PrimRef,embree::aligned_monitored_allocator<embree::PrimRef,32ul>>&,embree::BuildProgressMonitor&)::_lambda(embree::PrimRef_const&)_1_,embree::vector_t<embree::PrimRef,embree::aligned_monitored_allocator<embree::PrimRef,32ul>>>
              (__return_storage_ptr__,local_2e70,numPrimRefs,
               (vector_t<embree::PrimRef,_embree::aligned_monitored_allocator<embree::PrimRef,_32UL>_>
                *)&pinfo,(PrimInfo *)&split_primitive,(anon_class_8_1_78f12065 *)&primitiveArea,
               in_stack_ffffffffffffd178);
    return __return_storage_ptr__;
  }
  prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar10,"task cancelled");
  __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

PrimInfo createPrimRefArray_presplit(Scene* scene, Geometry::GTypeMask types, bool mblur, size_t numPrimRefs, mvector<PrimRef>& prims, BuildProgressMonitor& progressMonitor)
    {
      ParallelForForPrefixSumState<PrimInfo> pstate;
      Scene::Iterator2 iter(scene,types,mblur);

      /* first try */
      progressMonitor(0);
      pstate.init(iter,size_t(1024));
      PrimInfo pinfo = parallel_for_for_prefix_sum0( pstate, iter, PrimInfo(empty), [&](Geometry* mesh, const range<size_t>& r, size_t k, size_t geomID) -> PrimInfo {
	  return mesh->createPrimRefArray(prims,r,k,(unsigned)geomID);
	}, [](const PrimInfo& a, const PrimInfo& b) -> PrimInfo { return PrimInfo::merge(a,b); });
      
      /* if we need to filter out geometry, run again */
      if (pinfo.size() != numPrimRefs)
	{
	  progressMonitor(0);
	  pinfo = parallel_for_for_prefix_sum1( pstate, iter, PrimInfo(empty), [&](Geometry* mesh, const range<size_t>& r, size_t k, size_t geomID, const PrimInfo& base) -> PrimInfo {
	      return mesh->createPrimRefArray(prims,r,base.size(),(unsigned)geomID);
	    }, [](const PrimInfo& a, const PrimInfo& b) -> PrimInfo { return PrimInfo::merge(a,b); });
	}


      SplitterFactory Splitter(scene);
        
      auto split_primitive = [&] (const PrimRef &prim,
                                  const unsigned int splitprims,
                                  const SplittingGrid& grid,
                                  PrimRef subPrims[MAX_PRESPLITS_PER_PRIMITIVE],
                                  unsigned int& numSubPrims)
      {
         const auto splitter = Splitter(prim);
         splitPrimitive(splitter,prim,splitprims,grid,subPrims,numSubPrims);
      };
      
      auto primitiveArea = [&] (const PrimRef &ref) {
        const unsigned int geomID = ref.geomID();
        const unsigned int primID = ref.primID();
        return ((Mesh*)scene->get(geomID))->projectedPrimitiveArea(primID);
      };
      
      return createPrimRefArray_presplit(numPrimRefs,prims,pinfo,split_primitive,primitiveArea);
    }